

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYs<unsigned_long_long> *pGVar9;
  TransformerLogLin *pTVar10;
  ImPlotPlot *pIVar11;
  GetterXsYRef<unsigned_long_long> *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  ImDrawIdx IVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  pIVar15 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  lVar18 = (long)(((pGVar9->Offset + prim) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride;
  uVar2 = *(unsigned_long_long *)((long)pGVar9->Xs + lVar18);
  uVar3 = *(unsigned_long_long *)((long)pGVar9->Ys + lVar18);
  dVar24 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = GImPlot;
  pIVar11 = pIVar15->CurrentPlot;
  dVar4 = (pIVar11->XAxis).Range.Min;
  iVar6 = pTVar10->YAxis;
  fVar20 = (float)((((double)(float)(dVar24 / pIVar15->LogDenX) *
                     ((pIVar11->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar6].Min.x);
  fVar21 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
                   pIVar11->YAxis[iVar6].Range.Min) * pIVar15->My[iVar6] +
                  (double)pIVar15->PixelRange[iVar6].Min.y);
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar6 = pGVar12->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar12->Xs +
           (long)(((prim + pGVar12->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar12->Stride);
  dVar4 = pGVar12->YRef;
  dVar25 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar16->CurrentPlot;
  dVar24 = (pIVar11->XAxis).Range.Min;
  iVar6 = pTVar10->YAxis;
  fVar26 = (float)((((double)(float)(dVar25 / pIVar16->LogDenX) *
                     ((pIVar11->XAxis).Range.Max - dVar24) + dVar24) - dVar24) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar6].Min.x);
  fVar27 = (float)((dVar4 - pIVar11->YAxis[iVar6].Range.Min) * pIVar16->My[iVar6] +
                  (double)pIVar16->PixelRange[iVar6].Min.y);
  fVar22 = fVar21;
  if (fVar27 <= fVar21) {
    fVar22 = fVar27;
  }
  bVar19 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(~-(uint)(fVar27 <= fVar21) & (uint)fVar27 |
                      -(uint)(fVar27 <= fVar21) & (uint)fVar21), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar20;
    if (fVar26 <= fVar20) {
      fVar22 = fVar26;
    }
    bVar19 = false;
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar26 <= fVar20) & (uint)fVar26 |
                      -(uint)(fVar26 <= fVar20) & (uint)fVar20);
      bVar19 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar19 != false) {
    fVar22 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar28 = fVar26 - fVar20;
    fVar29 = fVar27 - fVar21;
    fVar23 = fVar28 * fVar28 + fVar29 * fVar29;
    if (0.0 < fVar23) {
      if (fVar23 < 0.0) {
        fVar23 = sqrtf(fVar23);
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      fVar28 = fVar28 * (1.0 / fVar23);
      fVar29 = fVar29 * (1.0 / fVar23);
    }
    fVar22 = fVar22 * 0.5;
    fVar28 = fVar28 * fVar22;
    fVar22 = fVar22 * fVar29;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar22 + fVar20;
    (pIVar13->pos).y = fVar21 - fVar28;
    pIVar13->uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar7;
    pIVar13[1].pos.x = fVar22 + fVar26;
    pIVar13[1].pos.y = fVar27 - fVar28;
    pIVar13[1].uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar7;
    pIVar13[2].pos.x = fVar26 - fVar22;
    pIVar13[2].pos.y = fVar28 + fVar27;
    pIVar13[2].uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar7;
    pIVar13[3].pos.x = fVar20 - fVar22;
    pIVar13[3].pos.y = fVar28 + fVar21;
    pIVar13[3].uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar8;
    *pIVar14 = IVar17;
    pIVar14[1] = IVar17 + 1;
    pIVar14[2] = IVar17 + 2;
    pIVar14[3] = IVar17;
    pIVar14[4] = IVar17 + 2;
    pIVar14[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }